

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_entropy.c
# Opt level: O0

double * inform_local_transfer_entropy
                   (int *src,int *dst,int *back,size_t l,size_t n,size_t m,int b,size_t k,double *te
                   ,inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  void *__ptr;
  int *state_00;
  int *history_00;
  int *source_00;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong local_168;
  size_t i;
  double v;
  double u;
  double t;
  double s;
  int *predicate;
  int *source;
  int *history;
  int *state;
  int *state_data;
  inform_dist predicates;
  inform_dist sources;
  inform_dist histories;
  inform_dist states;
  uint32_t *histogram_data;
  size_t total_size;
  size_t predicates_size;
  size_t sources_size;
  size_t histories_size;
  size_t states_size;
  size_t r;
  size_t q;
  _Bool allocate;
  size_t N;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *back_local;
  int *dst_local;
  int *src_local;
  
  _Var1 = check_arguments(src,dst,back,l,n,m,b,k,err);
  if (_Var1) {
    src_local = (int *)0x0;
  }
  else {
    uVar2 = n * (m - k);
    bVar9 = te == (double *)0x0;
    if ((bVar9) && (te = (double *)malloc(uVar2 * 8), te == (double *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      src_local = (int *)0x0;
    }
    else {
      auVar11._8_4_ = (int)(k >> 0x20);
      auVar11._0_8_ = k;
      auVar11._12_4_ = 0x45300000;
      dVar10 = pow((double)b,
                   (auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
      uVar3 = (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
      auVar12._8_4_ = (int)(l >> 0x20);
      auVar12._0_8_ = l;
      auVar12._12_4_ = 0x45300000;
      dVar10 = pow((double)b,
                   (auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)l) - 4503599627370496.0));
      uVar4 = (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
      lVar5 = (long)(b * b) * uVar3 * uVar4;
      puVar6 = (uint32_t *)(uVar3 * uVar4);
      puVar7 = (uint32_t *)((long)b * uVar3 * uVar4);
      puVar8 = (uint32_t *)((long)b * uVar3 * uVar4);
      __ptr = calloc((size_t)((long)((long)(lVar5 + (long)puVar6) + (long)puVar7) + (long)puVar8),4)
      ;
      if (__ptr == (void *)0x0) {
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        src_local = (int *)0x0;
      }
      else {
        sources.counts = (long)__ptr + lVar5 * 4;
        predicates.counts = (long)__ptr + (long)puVar6 * 4 + lVar5 * 4;
        state_data = (int *)((long)__ptr + (long)puVar7 * 4 + (long)puVar6 * 4 + lVar5 * 4);
        predicates.histogram = puVar8;
        predicates.size = uVar2;
        sources.histogram = puVar7;
        sources.size = uVar2;
        histories.histogram = puVar6;
        histories.size = uVar2;
        histories.counts = (uint64_t)__ptr;
        state_00 = (int *)malloc(uVar2 * 0x10);
        if (state_00 == (int *)0x0) {
          if (bVar9) {
            free(te);
          }
          free(__ptr);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          src_local = (int *)0x0;
        }
        else {
          history_00 = state_00 + uVar2;
          source_00 = history_00 + uVar2;
          accumulate_local_observations
                    (src,dst,back,l,n,m,b,k,(inform_dist *)&histories.counts,
                     (inform_dist *)&sources.counts,(inform_dist *)&predicates.counts,
                     (inform_dist *)&state_data,state_00,history_00,source_00,source_00 + uVar2);
          for (local_168 = 0; local_168 < uVar2; local_168 = local_168 + 1) {
            dVar10 = log2(((double)*(uint *)(histories.counts + (long)state_00[local_168] * 4) *
                          (double)*(uint *)(sources.counts + (long)history_00[local_168] * 4)) /
                          ((double)*(uint *)(predicates.counts + (long)source_00[local_168] * 4) *
                          (double)(uint)state_data[(source_00 + uVar2)[local_168]]));
            te[local_168] = dVar10;
          }
          free(state_00);
          free(__ptr);
          src_local = (int *)te;
        }
      }
    }
  }
  return (double *)src_local;
}

Assistant:

double *inform_local_transfer_entropy(int const *src, int const *dst,
    int const *back, size_t l, size_t n, size_t m, int b, size_t k, double *te,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate = (te == NULL);
    if (allocate)
    {
        te = malloc(N * sizeof(double));
        if (te == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const q = (size_t) pow((double) b, (double) k);
    size_t const r = (size_t) pow((double) b, (double) l);
    size_t const states_size     = b*b*q*r;
    size_t const histories_size  = q*r;
    size_t const sources_size    = b*q*r;
    size_t const predicates_size = b*q*r;
    size_t const total_size = states_size + histories_size + sources_size + predicates_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states     = { histogram_data, states_size, N };
    inform_dist histories  = { histogram_data + states_size, histories_size, N };
    inform_dist sources    = { histogram_data + states_size + histories_size, sources_size, N };
    inform_dist predicates = { histogram_data + states_size + histories_size + sources_size, predicates_size, N };

    int *state_data = malloc(4 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate) free(te);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state     = state_data;
    int *history   = state + N;
    int *source    = history + N;
    int *predicate = source + N;

    accumulate_local_observations(src, dst, back, l, n, m, b, k, &states,
        &histories, &sources, &predicates, state, history, source, predicate);

    double s, t, u, v;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        t = sources.histogram[source[i]];
        u = predicates.histogram[predicate[i]];
        v = histories.histogram[history[i]];
        te[i] = log2((s*v)/(t*u));
    }

    free(state_data);
    free(histogram_data);

    return te;
}